

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpaqueInstancePath.cpp
# Opt level: O0

void __thiscall slang::ast::OpaqueInstancePath::buildPath(OpaqueInstancePath *this,Symbol *symbol)

{
  bool bVar1;
  Symbol *pSVar2;
  InstanceBodySymbol *pIVar3;
  CheckerInstanceBodySymbol *pCVar4;
  GenerateBlockSymbol *pGVar5;
  reference puVar6;
  InstanceSymbol *pIVar7;
  CheckerInstanceSymbol *pCVar8;
  InstanceSymbol *in_RSI;
  span<const_unsigned_int,_18446744073709551615UL> *in_RDI;
  uint idx;
  iterator __end5;
  iterator __begin5;
  span<const_unsigned_int,_18446744073709551615UL> *__range5;
  InstanceSymbolBase *inst;
  Symbol *parent;
  SyntaxNode *syntax;
  Symbol *current;
  Scope *scope;
  Entry in_stack_ffffffffffffff90;
  Entry in_stack_ffffffffffffff98;
  __normal_iterator<const_unsigned_int_*,_std::span<const_unsigned_int,_18446744073709551615UL>_>
  local_50;
  span<const_unsigned_int,_18446744073709551615UL> *local_48;
  InstanceSymbolBase *local_40;
  Entry local_38;
  Symbol *local_30;
  SyntaxNode *local_28;
  InstanceSymbol *local_20;
  
  local_20 = in_RSI;
  pSVar2 = (Symbol *)Symbol::getHierarchicalParent((Symbol *)in_stack_ffffffffffffff98.value);
  pIVar7 = local_20;
  if ((local_20->super_InstanceSymbolBase).super_Symbol.kind == InstanceBody) {
    pIVar3 = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x7523da);
    local_20 = pIVar3->parentInstance;
  }
  else if ((local_20->super_InstanceSymbolBase).super_Symbol.kind == CheckerInstanceBody) {
    pCVar4 = Symbol::as<slang::ast::CheckerInstanceBodySymbol>((Symbol *)0x7523f9);
    local_20 = (InstanceSymbol *)pCVar4->parentInstance;
  }
  local_28 = Symbol::getSyntax((Symbol *)local_20);
  if ((pSVar2 != (Symbol *)0x0) &&
     ((((local_30 = Scope::asSymbol((Scope *)pSVar2), local_30->kind == InstanceBody ||
        (local_30->kind == InstanceArray)) || (local_30->kind == CheckerInstance)) ||
      ((local_30->kind == GenerateBlock || (local_30->kind == GenerateBlockArray)))))) {
    buildPath((OpaqueInstancePath *)pIVar7,pSVar2);
  }
  if ((local_20->super_InstanceSymbolBase).super_Symbol.kind == GenerateBlock) {
    if ((pSVar2 != (Symbol *)0x0) &&
       (pSVar2 = Scope::asSymbol((Scope *)pSVar2), pSVar2->kind == GenerateBlockArray)) {
      pGVar5 = Symbol::as<slang::ast::GenerateBlockSymbol>((Symbol *)0x7524a7);
      Entry::Entry(&local_38,pGVar5->constructIndex);
      SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::push_back
                ((SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *)
                 in_stack_ffffffffffffff90.value,(Entry *)in_RDI);
      return;
    }
  }
  else if (((local_20->super_InstanceSymbolBase).super_Symbol.kind == Instance) ||
          ((local_20->super_InstanceSymbolBase).super_Symbol.kind == CheckerInstance)) {
    local_40 = Symbol::as<slang::ast::InstanceSymbolBase>((Symbol *)0x7524ee);
    bVar1 = std::span<const_unsigned_int,_18446744073709551615UL>::empty
                      ((span<const_unsigned_int,_18446744073709551615UL> *)0x752501);
    if (!bVar1) {
      local_48 = &local_40->arrayPath;
      local_50._M_current =
           (uint *)std::span<const_unsigned_int,_18446744073709551615UL>::begin(in_RDI);
      std::span<const_unsigned_int,_18446744073709551615UL>::end
                ((span<const_unsigned_int,_18446744073709551615UL> *)in_stack_ffffffffffffff98.value
                );
      while (bVar1 = __gnu_cxx::
                     operator==<const_unsigned_int_*,_std::span<const_unsigned_int,_18446744073709551615UL>_>
                               ((__normal_iterator<const_unsigned_int_*,_std::span<const_unsigned_int,_18446744073709551615UL>_>
                                 *)in_stack_ffffffffffffff90.value,
                                (__normal_iterator<const_unsigned_int_*,_std::span<const_unsigned_int,_18446744073709551615UL>_>
                                 *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
        puVar6 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::span<const_unsigned_int,_18446744073709551615UL>_>
                 ::operator*(&local_50);
        Entry::Entry((Entry *)&stack0xffffffffffffff98,*puVar6);
        SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::push_back
                  ((SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *)
                   in_stack_ffffffffffffff90.value,(Entry *)in_RDI);
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::span<const_unsigned_int,_18446744073709551615UL>_>
        ::operator++(&local_50);
      }
      return;
    }
    if (local_28 == (SyntaxNode *)0x0) {
      if ((local_20->super_InstanceSymbolBase).super_Symbol.kind == Instance) {
        pIVar7 = Symbol::as<slang::ast::InstanceSymbol>((Symbol *)0x7525a5);
        local_28 = Symbol::getSyntax(&pIVar7->body->super_Symbol);
      }
      else {
        pCVar8 = Symbol::as<slang::ast::CheckerInstanceSymbol>((Symbol *)0x7525bf);
        local_28 = Symbol::getSyntax(&pCVar8->body->super_Symbol);
      }
    }
  }
  else if ((((local_20->super_InstanceSymbolBase).super_Symbol.kind == InstanceArray) &&
           (pSVar2 != (Symbol *)0x0)) &&
          (pSVar2 = Scope::asSymbol((Scope *)pSVar2), pSVar2->kind == InstanceArray)) {
    return;
  }
  Entry::Entry((Entry *)&stack0xffffffffffffff90,local_28);
  SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::push_back
            ((SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *)
             in_stack_ffffffffffffff90.value,(Entry *)in_RDI);
  return;
}

Assistant:

void OpaqueInstancePath::buildPath(const Symbol& symbol) {
    auto scope = symbol.getHierarchicalParent();
    const Symbol* current;
    if (symbol.kind == SymbolKind::InstanceBody)
        current = symbol.as<InstanceBodySymbol>().parentInstance;
    else if (symbol.kind == SymbolKind::CheckerInstanceBody)
        current = symbol.as<CheckerInstanceBodySymbol>().parentInstance;
    else
        current = &symbol;

    SLANG_ASSERT(current);
    auto syntax = current->getSyntax();

    if (scope) {
        auto& parent = scope->asSymbol();
        if (parent.kind == SymbolKind::InstanceBody || parent.kind == SymbolKind::InstanceArray ||
            parent.kind == SymbolKind::CheckerInstance ||
            parent.kind == SymbolKind::GenerateBlock ||
            parent.kind == SymbolKind::GenerateBlockArray) {
            buildPath(parent);
        }
    }

    if (current->kind == SymbolKind::GenerateBlock) {
        if (scope && scope->asSymbol().kind == SymbolKind::GenerateBlockArray) {
            entries.push_back(current->as<GenerateBlockSymbol>().constructIndex);
            return;
        }
    }
    else if (current->kind == SymbolKind::Instance ||
             current->kind == SymbolKind::CheckerInstance) {
        auto& inst = current->as<InstanceSymbolBase>();
        if (!inst.arrayPath.empty()) {
            for (auto idx : inst.arrayPath)
                entries.push_back(idx);
            return;
        }

        if (!syntax) {
            if (current->kind == SymbolKind::Instance)
                syntax = current->as<InstanceSymbol>().body.getSyntax();
            else
                syntax = current->as<CheckerInstanceSymbol>().body.getSyntax();
        }
    }
    else if (current->kind == SymbolKind::InstanceArray) {
        if (scope && scope->asSymbol().kind == SymbolKind::InstanceArray)
            return;
    }

    SLANG_ASSERT(syntax);
    entries.push_back(*syntax);
}